

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

Error CheckArgumentValue(char *arg)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  char *in_RSI;
  Error EVar1;
  exception *e;
  allocator local_39;
  string local_38 [40];
  char *arg_local;
  
  arg_local = arg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,in_RSI,&local_39);
  std::__cxx11::stoi((string *)local_38,(size_t *)0x0,10);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  std::shared_ptr<gerr::details::IError>::shared_ptr
            ((shared_ptr<gerr::details::IError> *)arg,(nullptr_t)0x0);
  EVar1.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar1.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)arg;
  return (Error)EVar1.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

gerr::Error CheckArgumentValue(char const* arg) {
  try {
    std::stoi(arg);
  } catch (std::exception const& e) {
    return gerr::New("conv exception:{}", arg, e.what());
  }
  return nullptr;
}